

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O2

void __thiscall
TPZFNMatrix<45,_Fad<double>_>::TPZFNMatrix
          (TPZFNMatrix<45,_Fad<double>_> *this,int64_t row,int64_t col,Fad<double> *val)

{
  Fad<double> *buf;
  long lVar1;
  Fad<double> FStack_48;
  
  (this->super_TPZFMatrix<Fad<double>_>).super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFNMatrix_016d15a0;
  buf = this->fBuf;
  TPZFMatrix<Fad<double>_>::TPZFMatrix
            (&this->super_TPZFMatrix<Fad<double>_>,&PTR_PTR_016d1858,row,col,buf,0x2d);
  (this->super_TPZFMatrix<Fad<double>_>).super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFNMatrix_016d15a0;
  lVar1 = 0;
  do {
    Fad<double>::Fad(buf);
    lVar1 = lVar1 + -0x20;
    buf = buf + 1;
  } while (lVar1 != -0x5c0);
  Fad<double>::Fad(&FStack_48,val);
  TPZFMatrix<Fad<double>_>::operator=(&this->super_TPZFMatrix<Fad<double>_>,&FStack_48);
  Fad<double>::~Fad(&FStack_48);
  return;
}

Assistant:

inline  TPZFNMatrix(int64_t row, int64_t col, const TVar &val) : TPZRegisterClassId(&TPZFNMatrix<N,TVar>::ClassId), 
    TPZFMatrix<TVar>(row,col,fBuf,N) {
        TPZFMatrix<TVar>::operator=(val);
    }